

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void CoreML::Specification::Metadata::
     SerializeWithCachedSizes(google::protobuf::io::CodedOutputStream*)::string_>_const__
               (ConstPtr p)

{
  char *pcVar1;
  int iVar2;
  ConstPtr p_local;
  
  pcVar1 = (char *)std::__cxx11::string::data();
  iVar2 = std::__cxx11::string::length();
  google::protobuf::internal::WireFormatLite::VerifyUtf8String
            (pcVar1,iVar2,SERIALIZE,"CoreML.Specification.Metadata.UserDefinedEntry.key");
  pcVar1 = (char *)std::__cxx11::string::data();
  iVar2 = std::__cxx11::string::length();
  google::protobuf::internal::WireFormatLite::VerifyUtf8String
            (pcVar1,iVar2,SERIALIZE,"CoreML.Specification.Metadata.UserDefinedEntry.value");
  return;
}

Assistant:

static void Check(ConstPtr p) {
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          p->first.data(), p->first.length(),
          ::google::protobuf::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.Metadata.UserDefinedEntry.key");
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          p->second.data(), p->second.length(),
          ::google::protobuf::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.Metadata.UserDefinedEntry.value");
      }